

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

PaError PaAlsaStreamComponent_DetermineFramesPerBuffer
                  (PaAlsaStreamComponent *self,PaStreamParameters *params,
                  unsigned_long framesPerUserBuffer,double sampleRate,snd_pcm_hw_params_t *hwParams,
                  int *accurate)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  PaAlsaStreamComponent *pPVar6;
  double dVar7;
  unsigned_long framesPerHostBuffer;
  int dir;
  uint minPeriods;
  uint maxPeriods;
  PaError local_64;
  ulong local_60;
  int local_54;
  PaAlsaStreamComponent *local_50;
  ulong local_48;
  ulong local_40;
  int *local_38;
  
  uVar5 = numPeriods_;
  dVar7 = sampleRate * params->suggestedLatency;
  uVar3 = (ulong)dVar7;
  uVar3 = (long)(dVar7 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
  if (uVar3 <= framesPerUserBuffer) {
    uVar3 = framesPerUserBuffer;
  }
  local_40 = local_40 & 0xffffffff00000000;
  local_48 = CONCAT44(local_48._4_4_,numPeriods_);
  local_54 = 0;
  local_50 = self;
  local_38 = accurate;
  iVar2 = snd_pcm_hw_params_get_periods_min(hwParams);
  local_64 = 0;
  if (iVar2 < 0) {
    PaAlsaStreamComponent_DetermineFramesPerBuffer_cold_1();
    local_64 = -9999;
    bVar1 = true;
    pPVar6 = local_50;
  }
  else {
    iVar2 = snd_pcm_hw_params_get_periods_max(hwParams,&local_40,&local_54);
    pPVar6 = local_50;
    if (iVar2 < 0) {
      PaAlsaStreamComponent_DetermineFramesPerBuffer_cold_2();
      local_64 = -9999;
      bVar1 = true;
      pPVar6 = local_50;
    }
    else {
      if ((uint)local_40 < 2) {
        __assert_fail("maxPeriods > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0x918,
                      "PaError PaAlsaStreamComponent_DetermineFramesPerBuffer(PaAlsaStreamComponent *, const PaStreamParameters *, unsigned long, double, snd_pcm_hw_params_t *, int *)"
                     );
      }
      if (uVar5 < (uint)local_48) {
        uVar5 = (uint)local_48;
      }
      if ((uint)local_40 < uVar5) {
        uVar5 = (uint)local_40;
      }
      bVar1 = false;
      local_60 = (uVar3 + framesPerUserBuffer) / (ulong)uVar5;
      if (framesPerUserBuffer != 0) {
        lVar4 = framesPerUserBuffer - local_60 % framesPerUserBuffer;
        if (local_60 % framesPerUserBuffer == 0) {
          lVar4 = 0;
        }
        local_60 = lVar4 + local_60;
        if (local_60 < framesPerUserBuffer) {
          if (framesPerUserBuffer % local_60 != 0) {
            __assert_fail("framesPerUserBuffer % framesPerHostBuffer == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                          ,0x92d,
                          "PaError PaAlsaStreamComponent_DetermineFramesPerBuffer(PaAlsaStreamComponent *, const PaStreamParameters *, unsigned long, double, snd_pcm_hw_params_t *, int *)"
                         );
          }
          iVar2 = snd_pcm_hw_params_test_period_size(local_50->pcm,hwParams,local_60,0);
          local_64 = 0;
          bVar1 = false;
          if (iVar2 < 0) {
            iVar2 = snd_pcm_hw_params_test_period_size(pPVar6->pcm,hwParams,local_60 * 2,0);
            if (iVar2 == 0) {
              local_60 = local_60 << 1;
              bVar1 = false;
            }
            else {
              iVar2 = snd_pcm_hw_params_test_period_size(pPVar6->pcm,hwParams,local_60 >> 1,0);
              bVar1 = false;
              if (iVar2 == 0) {
                local_60 = local_60 >> 1;
              }
            }
          }
        }
        else {
          if (local_60 % framesPerUserBuffer != 0) {
            __assert_fail("framesPerHostBuffer % framesPerUserBuffer == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                          ,0x938,
                          "PaError PaAlsaStreamComponent_DetermineFramesPerBuffer(PaAlsaStreamComponent *, const PaStreamParameters *, unsigned long, double, snd_pcm_hw_params_t *, int *)"
                         );
          }
          iVar2 = snd_pcm_hw_params_test_period_size(local_50->pcm,hwParams,local_60,0);
          bVar1 = false;
          if (iVar2 < 0) {
            bVar1 = false;
            iVar2 = snd_pcm_hw_params_test_period_size
                              (pPVar6->pcm,hwParams,local_60 + framesPerUserBuffer,0);
            if (iVar2 == 0) {
              local_60 = local_60 + framesPerUserBuffer;
            }
            else {
              iVar2 = snd_pcm_hw_params_test_period_size
                                (pPVar6->pcm,hwParams,local_60 - framesPerUserBuffer,0);
              bVar1 = false;
              if (iVar2 == 0) {
                local_60 = local_60 - framesPerUserBuffer;
              }
            }
          }
        }
      }
    }
  }
  if (!bVar1) {
    local_40 = 0;
    local_48 = 0;
    iVar2 = snd_pcm_hw_params_get_period_size_min(hwParams,&local_40,0);
    if (iVar2 < 0) {
      PaAlsaStreamComponent_DetermineFramesPerBuffer_cold_3();
      local_64 = -9999;
      bVar1 = true;
    }
    else {
      iVar2 = snd_pcm_hw_params_get_period_size_max(hwParams,&local_48,0);
      if (iVar2 < 0) {
        PaAlsaStreamComponent_DetermineFramesPerBuffer_cold_4();
        local_64 = -9999;
        bVar1 = true;
      }
      else {
        if (local_60 < local_40) {
          local_60 = local_40 + (local_48 - local_40 == 2);
        }
        else if (local_48 < local_60) {
          local_60 = local_48 - (local_48 - local_40 == 2);
        }
        local_54 = 0;
        iVar2 = snd_pcm_hw_params_set_period_size_near(pPVar6->pcm,hwParams,&local_60);
        if (iVar2 < 0) {
          PaAlsaStreamComponent_DetermineFramesPerBuffer_cold_5();
          local_64 = -9999;
          bVar1 = true;
        }
        else {
          bVar1 = false;
          if (local_54 != 0) {
            *local_38 = 0;
          }
        }
      }
    }
    if (!bVar1) {
      pPVar6->framesPerPeriod = local_60;
    }
  }
  return local_64;
}

Assistant:

static PaError PaAlsaStreamComponent_DetermineFramesPerBuffer( PaAlsaStreamComponent* self, const PaStreamParameters* params,
        unsigned long framesPerUserBuffer, double sampleRate, snd_pcm_hw_params_t* hwParams, int* accurate )
{
    PaError result = paNoError;
    unsigned long bufferSize, framesPerHostBuffer;
    int dir = 0;

    /* Calculate host buffer size */
    bufferSize = PaAlsa_GetFramesPerHostBuffer(framesPerUserBuffer, params->suggestedLatency, sampleRate);

    /* Log */
    PA_DEBUG(( "%s: user-buffer (frames)           = %lu\n", __FUNCTION__, framesPerUserBuffer ));
    PA_DEBUG(( "%s: user-buffer (sec)              = %f\n",  __FUNCTION__, (double)(framesPerUserBuffer / sampleRate) ));
    PA_DEBUG(( "%s: suggested latency (sec)        = %f\n",  __FUNCTION__, params->suggestedLatency ));
    PA_DEBUG(( "%s: suggested host buffer (frames) = %lu\n", __FUNCTION__, bufferSize ));
    PA_DEBUG(( "%s: suggested host buffer (sec)    = %f\n",  __FUNCTION__, (double)(bufferSize / sampleRate) ));

#ifdef PA_ALSA_USE_OBSOLETE_HOST_BUFFER_CALC

    if( framesPerUserBuffer != paFramesPerBufferUnspecified )
    {
        /* Preferably the host buffer size should be a multiple of the user buffer size */

        if( bufferSize > framesPerUserBuffer )
        {
            snd_pcm_uframes_t remainder = bufferSize % framesPerUserBuffer;
            if( remainder > framesPerUserBuffer / 2. )
                bufferSize += framesPerUserBuffer - remainder;
            else
                bufferSize -= remainder;

            assert( bufferSize % framesPerUserBuffer == 0 );
        }
        else if( framesPerUserBuffer % bufferSize != 0 )
        {
            /*  Find a good compromise between user specified latency and buffer size */
            if( bufferSize > framesPerUserBuffer * .75 )
            {
                bufferSize = framesPerUserBuffer;
            }
            else
            {
                snd_pcm_uframes_t newSz = framesPerUserBuffer;
                while( newSz / 2 >= bufferSize )
                {
                    if( framesPerUserBuffer % (newSz / 2) != 0 )
                    {
                        /* No use dividing any further */
                        break;
                    }
                    newSz /= 2;
                }
                bufferSize = newSz;
            }

            assert( framesPerUserBuffer % bufferSize == 0 );
        }
    }

#endif

    {
        unsigned numPeriods = numPeriods_, maxPeriods = 0, minPeriods = numPeriods_;

        /* It may be that the device only supports 2 periods for instance */
        dir = 0;
        ENSURE_( alsa_snd_pcm_hw_params_get_periods_min( hwParams, &minPeriods, &dir ), paUnanticipatedHostError );
        ENSURE_( alsa_snd_pcm_hw_params_get_periods_max( hwParams, &maxPeriods, &dir ), paUnanticipatedHostError );
        assert( maxPeriods > 1 );

        /* Clamp to min/max */
        numPeriods = PA_MIN(maxPeriods, PA_MAX(minPeriods, numPeriods));

        PA_DEBUG(( "%s: periods min = %lu, max = %lu, req = %lu \n", __FUNCTION__, minPeriods, maxPeriods, numPeriods ));

#ifndef PA_ALSA_USE_OBSOLETE_HOST_BUFFER_CALC

        /* Calculate period size */
        framesPerHostBuffer = (bufferSize / numPeriods);

        /* Align & test size */
        if( framesPerUserBuffer != paFramesPerBufferUnspecified )
        {
            /* Align to user buffer size */
            framesPerHostBuffer = PaAlsa_AlignForward(framesPerHostBuffer, framesPerUserBuffer);

            /* Test (borrowed from older implementation) */
            if( framesPerHostBuffer < framesPerUserBuffer )
            {
                assert( framesPerUserBuffer % framesPerHostBuffer == 0 );
                if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer, 0 ) < 0 )
                {
                    if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer * 2, 0 ) == 0 )
                        framesPerHostBuffer *= 2;
                    else if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer / 2, 0 ) == 0 )
                        framesPerHostBuffer /= 2;
                }
            }
            else
            {
                assert( framesPerHostBuffer % framesPerUserBuffer == 0 );
                if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer, 0 ) < 0 )
                {
                    if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer + framesPerUserBuffer, 0 ) == 0 )
                        framesPerHostBuffer += framesPerUserBuffer;
                    else if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer - framesPerUserBuffer, 0 ) == 0 )
                        framesPerHostBuffer -= framesPerUserBuffer;
                }
            }
        }
#endif

#ifdef PA_ALSA_USE_OBSOLETE_HOST_BUFFER_CALC

        if( framesPerUserBuffer != paFramesPerBufferUnspecified )
        {
            /* Try to get a power-of-two of the user buffer size. */
            framesPerHostBuffer = framesPerUserBuffer;
            if( framesPerHostBuffer < bufferSize )
            {
                while( bufferSize / framesPerHostBuffer > numPeriods )
                {
                    framesPerHostBuffer *= 2;
                }
                /* One extra period is preferrable to one less (should be more robust) */
                if( bufferSize / framesPerHostBuffer < numPeriods )
                {
                    framesPerHostBuffer /= 2;
                }
            }
            else
            {
                while( bufferSize / framesPerHostBuffer < numPeriods )
                {
                    if( framesPerUserBuffer % ( framesPerHostBuffer / 2 ) != 0 )
                    {
                        /* Can't be divided any further */
                        break;
                    }
                    framesPerHostBuffer /= 2;
                }
            }

            if( framesPerHostBuffer < framesPerUserBuffer )
            {
                assert( framesPerUserBuffer % framesPerHostBuffer == 0 );
                if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer, 0 ) < 0 )
                {
                    if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer * 2, 0 ) == 0 )
                        framesPerHostBuffer *= 2;
                    else if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer / 2, 0 ) == 0 )
                        framesPerHostBuffer /= 2;
                }
            }
            else
            {
                assert( framesPerHostBuffer % framesPerUserBuffer == 0 );
                if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer, 0 ) < 0 )
                {
                    if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer + framesPerUserBuffer, 0 ) == 0 )
                        framesPerHostBuffer += framesPerUserBuffer;
                    else if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer - framesPerUserBuffer, 0 ) == 0 )
                        framesPerHostBuffer -= framesPerUserBuffer;
                }
            }
        }
        else
        {
            framesPerHostBuffer = bufferSize / numPeriods;
        }

        /* non-mmap mode needs a reasonably-sized buffer or it'll stutter */
        if( !self->canMmap && framesPerHostBuffer < 2048 )
            framesPerHostBuffer = 2048;
#endif
        PA_DEBUG(( "%s: suggested host buffer period   = %lu \n", __FUNCTION__, framesPerHostBuffer ));
    }

    {
        /* Get min/max period sizes and adjust our chosen */
        snd_pcm_uframes_t min = 0, max = 0, minmax_diff;
        ENSURE_( alsa_snd_pcm_hw_params_get_period_size_min( hwParams, &min, NULL ), paUnanticipatedHostError );
        ENSURE_( alsa_snd_pcm_hw_params_get_period_size_max( hwParams, &max, NULL ), paUnanticipatedHostError );
        minmax_diff = max - min;

        if( framesPerHostBuffer < min )
        {
            PA_DEBUG(( "%s: The determined period size (%lu) is less than minimum (%lu)\n", __FUNCTION__, framesPerHostBuffer, min ));
            framesPerHostBuffer = (( minmax_diff == 2 ) ? min + 1 : min );
        }
        else if( framesPerHostBuffer > max )
        {
            PA_DEBUG(( "%s: The determined period size (%lu) is greater than maximum (%lu)\n", __FUNCTION__, framesPerHostBuffer, max ));
            framesPerHostBuffer = (( minmax_diff == 2 ) ? max - 1 : max );
        }

        PA_DEBUG(( "%s: device period minimum          = %lu\n", __FUNCTION__, min ));
        PA_DEBUG(( "%s: device period maximum          = %lu\n", __FUNCTION__, max ));
        PA_DEBUG(( "%s: host buffer period             = %lu\n", __FUNCTION__, framesPerHostBuffer ));
        PA_DEBUG(( "%s: host buffer period latency     = %f\n", __FUNCTION__, (double)( framesPerHostBuffer / sampleRate ) ));

        /* Try setting period size */
        dir = 0;
        ENSURE_( alsa_snd_pcm_hw_params_set_period_size_near( self->pcm, hwParams, &framesPerHostBuffer, &dir ), paUnanticipatedHostError );
        if( dir != 0 )
        {
            PA_DEBUG(( "%s: The configured period size is non-integer.\n", __FUNCTION__, dir ));
            *accurate = 0;
        }
    }

    /* Set result */
    self->framesPerPeriod = framesPerHostBuffer;

error:
    return result;
}